

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow::Funcs::NodeWindows(ImVector<ImGuiWindow_*> *windows,char *label)

{
  ImVector<unsigned_int> *pIVar1;
  bool bVar2;
  int i;
  long lVar3;
  
  bVar2 = TreeNode(label,"%s (%d)",label,(ulong)(uint)windows->Size);
  if (bVar2) {
    for (lVar3 = 0; lVar3 < windows->Size; lVar3 = lVar3 + 1) {
      PushID(windows->Data[lVar3]);
      NodeWindow(windows->Data[lVar3],"Window");
      pIVar1 = &GImGui->CurrentWindow->IDStack;
      pIVar1->Size = pIVar1->Size + -1;
    }
    TreePop();
    return;
  }
  return;
}

Assistant:

static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                return;
            for (int i = 0; i < windows.Size; i++)
            {
                ImGui::PushID(windows[i]);
                Funcs::NodeWindow(windows[i], "Window");
                ImGui::PopID();
            }
            ImGui::TreePop();
        }